

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O0

void test_dbpointer(void)

{
  byte bVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  bson_oid_t *pbVar5;
  undefined8 uVar6;
  char **ppcVar7;
  bson_oid_t **ppbVar8;
  bson_t *bcon;
  bson_oid_t *ooid;
  bson_oid_t oid;
  char *collection;
  
  bson_oid_init((long)&ooid + 4,0);
  uVar3 = bson_bcon_magic();
  pcVar4 = bcon_ensure_const_char_ptr("collection");
  pbVar5 = bcon_ensure_const_oid_ptr((bson_oid_t *)((long)&ooid + 4));
  uVar3 = bcon_new(0,"foo",uVar3,0xb,pcVar4,pbVar5,0);
  uVar6 = bson_bcone_magic();
  ppcVar7 = bcon_ensure_const_char_ptr_ptr((char **)(oid.bytes + 4));
  ppbVar8 = bcon_ensure_const_oid_ptr_ptr((bson_oid_t **)&bcon);
  bVar1 = bcon_extract(uVar3,"foo",uVar6,0xb,ppcVar7,ppbVar8,0);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0xaa,"test_dbpointer",
            "BCON_EXTRACT (bcon, \"foo\", BCONE_DBPOINTER (collection, ooid))");
    abort();
  }
  iVar2 = strcmp((char *)oid.bytes._4_8_,"collection");
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0xac,"test_dbpointer","strcmp (collection, \"collection\") == 0");
    abort();
  }
  bVar1 = bson_oid_equal(bcon,(long)&ooid + 4);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0xad,"test_dbpointer","bson_oid_equal (ooid, &oid)");
    abort();
  }
  bson_destroy(uVar3);
  return;
}

Assistant:

static void
test_dbpointer (void)
{
   const char *collection;
   bson_oid_t oid;
   const bson_oid_t *ooid;
   bson_t *bcon;

   bson_oid_init (&oid, NULL);

   bcon = BCON_NEW ("foo", BCON_DBPOINTER ("collection", &oid));

   BSON_ASSERT (BCON_EXTRACT (bcon, "foo", BCONE_DBPOINTER (collection, ooid)));

   BSON_ASSERT (strcmp (collection, "collection") == 0);
   BSON_ASSERT (bson_oid_equal (ooid, &oid));

   bson_destroy (bcon);
}